

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

array_container_t * array_container_create_range(uint32_t min,uint32_t max)

{
  array_container_t *paVar1;
  long lVar2;
  
  paVar1 = array_container_create_given_capacity((max - min) + 1);
  if (paVar1 != (array_container_t *)0x0) {
    paVar1->cardinality = 0;
    lVar2 = 0;
    while (min + (int)lVar2 < max) {
      paVar1->cardinality = (int32_t)(lVar2 + 1);
      paVar1->array[lVar2] = (short)min + (short)lVar2;
      lVar2 = lVar2 + 1;
    }
  }
  return paVar1;
}

Assistant:

array_container_t *array_container_create_range(uint32_t min, uint32_t max) {
    array_container_t *answer =
        array_container_create_given_capacity(max - min + 1);
    if (answer == NULL) return answer;
    answer->cardinality = 0;
    for (uint32_t k = min; k < max; k++) {
        answer->array[answer->cardinality++] = k;
    }
    return answer;
}